

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SGDOptimizer::SharedCtor(SGDOptimizer *this)

{
  SGDOptimizer *this_local;
  
  memset(&this->learningrate_,0,0x18);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void SGDOptimizer::SharedCtor() {
  ::memset(&learningrate_, 0, reinterpret_cast<char*>(&momentum_) -
    reinterpret_cast<char*>(&learningrate_) + sizeof(momentum_));
  _cached_size_ = 0;
}